

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall
BoardView::DrawDiamond(BoardView *this,ImDrawList *draw,ImVec2 c,double r,uint32_t color)

{
  ImVec2 dia [4];
  ImVec2 local_28;
  float local_20;
  float local_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_28.x = c.x;
  local_1c = c.y;
  local_28.y = (float)((double)local_1c - r);
  local_20 = (float)((double)local_28.x + r);
  local_14 = (float)((double)local_1c + r);
  local_10 = (float)((double)local_28.x - r);
  local_18 = local_28.x;
  local_c = local_1c;
  ImDrawList::AddPolyline(draw,&local_28,4,color,1,1.0);
  return;
}

Assistant:

void BoardView::DrawDiamond(ImDrawList *draw, ImVec2 c, double r, uint32_t color) {
	ImVec2 dia[4];

	dia[0] = ImVec2(c.x, c.y - r);
	dia[1] = ImVec2(c.x + r, c.y);
	dia[2] = ImVec2(c.x, c.y + r);
	dia[3] = ImVec2(c.x - r, c.y);

	draw->AddPolyline(dia, 4, color, true, 1.0f);
}